

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMemory.cpp
# Opt level: O1

void * __thiscall SharedMemory::attach(SharedMemory *this,AttachFlag flag,void *address)

{
  void *pvVar1;
  int *piVar2;
  Log local_70;
  Log local_60;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_50;
  uint local_48;
  undefined1 local_40 [16];
  Log local_30;
  Log local_20;
  
  pvVar1 = this->mAddr;
  if (pvVar1 == (void *)0x0) {
    pvVar1 = shmat(this->mShm,address,
                   ((flag & ReadWrite) << 0xc | (uint)(address != (void *)0x0) << 0xd) ^ 0x1000);
    this->mAddr = pvVar1;
    if (pvVar1 == (void *)0xffffffffffffffff) {
      local_50.mValue = 1;
      Log::Log(&local_70,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_50);
      piVar2 = __errno_location();
      Rct::strerror((Rct *)&local_50,*piVar2);
      Log::write(&local_20,(int)&local_70,(void *)local_50,(ulong)local_48);
      if (local_20.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      Log::Log(&local_60,&local_70);
      Log::addStringStream<int>(&local_30,(int)&local_60);
      if (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((undefined1 *)local_50.mValue != local_40) {
        operator_delete((void *)local_50);
      }
      if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this->mAddr = (void *)0x0;
    }
    pvVar1 = this->mAddr;
  }
  return pvVar1;
}

Assistant:

void* SharedMemory::attach(AttachFlag flag, void* address)
{
    if (mAddr)
        return mAddr;

    int flg = address ? SHM_RND : 0;
    if (!(flag & Write))
        flg |= SHM_RDONLY;
    mAddr = shmat(mShm, address, flg);
    if (mAddr == reinterpret_cast<void*>(-1)) {
        error() << Rct::strerror() << errno;
        mAddr = 0;
    }
    return mAddr;
}